

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::edit_distance::CreateUnifiedDiff
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *left,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *right,size_t context)

{
  value_type vVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  unsigned_long *puVar6;
  const_reference pvVar7;
  char *pcVar8;
  reference pEVar9;
  difference_type dVar10;
  char edit_00;
  bool bVar11;
  ostream *local_300;
  EditType *local_2f0;
  int local_2a8;
  const_iterator cStack_2a0;
  EditType edit;
  __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  local_298;
  __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  local_290;
  __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  local_288;
  __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  local_280;
  __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  it;
  size_t n_suffix;
  size_t i;
  Hunk hunk;
  size_t prefix_context;
  stringstream local_1e0 [8];
  stringstream ss;
  ostream aoStack_1d0 [376];
  ulong local_58;
  size_t edit_i;
  size_t r_i;
  size_t l_i;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  edits;
  size_t context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *right_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *left_local;
  
  edits.
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)context;
  CalculateOptimalEdits
            ((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
              *)&l_i,left,right);
  r_i = 0;
  edit_i = 0;
  local_58 = 0;
  std::__cxx11::stringstream::stringstream(local_1e0);
  do {
    uVar2 = local_58;
    sVar4 = std::
            vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
            ::size((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                    *)&l_i);
    if (sVar4 <= uVar2) break;
    while( true ) {
      uVar2 = local_58;
      sVar4 = std::
              vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
              ::size((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                      *)&l_i);
      bVar11 = false;
      if (uVar2 < sVar4) {
        pvVar5 = std::
                 vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                 ::operator[]((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                               *)&l_i,local_58);
        bVar11 = *pvVar5 == kMatch;
      }
      if (!bVar11) break;
      r_i = r_i + 1;
      edit_i = edit_i + 1;
      local_58 = local_58 + 1;
    }
    puVar6 = std::min<unsigned_long>
                       (&r_i,(unsigned_long *)
                             &edits.
                              super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = *puVar6;
    anon_unknown_1::Hunk::Hunk
              ((Hunk *)&i,
               (r_i - hunk.hunk_removes_.
                      super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                      ._M_impl._M_node._M_size) + 1,
               (edit_i - hunk.hunk_removes_.
                         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                         ._M_impl._M_node._M_size) + 1);
    for (n_suffix = hunk.hunk_removes_.
                    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                    ._M_impl._M_node._M_size; n_suffix != 0; n_suffix = n_suffix - 1) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](left,r_i - n_suffix);
      pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(pvVar7);
      anon_unknown_1::Hunk::PushLine((Hunk *)&i,' ',pcVar8);
    }
    it._M_current = (EditType *)0x0;
    for (; uVar2 = local_58,
        sVar4 = std::
                vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                ::size((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                        *)&l_i), uVar2 < sVar4; local_58 = local_58 + 1) {
      if (edits.
          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage <= it._M_current) {
        local_288._M_current =
             (EditType *)
             std::
             vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             ::begin((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                      *)&l_i);
        local_280 = __gnu_cxx::
                    __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
                    ::operator+(&local_288,(long)(int)local_58);
        while( true ) {
          local_290._M_current =
               (EditType *)
               std::
               vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
               ::end((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                      *)&l_i);
          bVar3 = __gnu_cxx::
                  operator==<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
                            (&local_280,&local_290);
          bVar11 = false;
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            pEVar9 = __gnu_cxx::
                     __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
                     ::operator*(&local_280);
            bVar11 = *pEVar9 == kMatch;
          }
          if (!bVar11) break;
          __gnu_cxx::
          __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
          ::operator++(&local_280);
        }
        local_298._M_current =
             (EditType *)
             std::
             vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             ::end((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                    *)&l_i);
        bVar3 = __gnu_cxx::
                operator==<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
                          (&local_280,&local_298);
        bVar11 = true;
        if (!bVar3) {
          cStack_2a0 = std::
                       vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                       ::begin((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                *)&l_i);
          dVar10 = __gnu_cxx::operator-(&local_280,&stack0xfffffffffffffd60);
          bVar11 = edits.
                   super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage <=
                   (pointer)(dVar10 - local_58);
        }
        if (bVar11) break;
      }
      pvVar5 = std::
               vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
               ::operator[]((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                             *)&l_i,local_58);
      vVar1 = *pvVar5;
      if (vVar1 == kMatch) {
        local_2f0 = it._M_current + 1;
      }
      else {
        local_2f0 = (EditType *)0x0;
      }
      it._M_current = local_2f0;
      if (((vVar1 == kMatch) || (vVar1 == kRemove)) || (vVar1 == kReplace)) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](left,r_i);
        pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str(pvVar7);
        edit_00 = '-';
        if (vVar1 == kMatch) {
          edit_00 = ' ';
        }
        anon_unknown_1::Hunk::PushLine((Hunk *)&i,edit_00,pcVar8);
      }
      if ((vVar1 == kAdd) || (vVar1 == kReplace)) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](right,edit_i);
        pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str(pvVar7);
        anon_unknown_1::Hunk::PushLine((Hunk *)&i,'+',pcVar8);
      }
      r_i = (vVar1 != kAdd) + r_i;
      edit_i = (vVar1 != kRemove) + edit_i;
    }
    bVar11 = anon_unknown_1::Hunk::has_edits((Hunk *)&i);
    if (bVar11) {
      local_300 = (ostream *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x1e0) {
        local_300 = aoStack_1d0;
      }
      anon_unknown_1::Hunk::PrintTo((Hunk *)&i,local_300);
      local_2a8 = 0;
    }
    else {
      local_2a8 = 3;
    }
    anon_unknown_1::Hunk::~Hunk((Hunk *)&i);
  } while (local_2a8 == 0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1e0);
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::~vector((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             *)&l_i);
  return __return_storage_ptr__;
}

Assistant:

std::string CreateUnifiedDiff(const std::vector<std::string>& left,
                              const std::vector<std::string>& right,
                              size_t context) {
  const std::vector<EditType> edits = CalculateOptimalEdits(left, right);

  size_t l_i = 0, r_i = 0, edit_i = 0;
  std::stringstream ss;
  while (edit_i < edits.size()) {
    // Find first edit.
    while (edit_i < edits.size() && edits[edit_i] == kMatch) {
      ++l_i;
      ++r_i;
      ++edit_i;
    }

    // Find the first line to include in the hunk.
    const size_t prefix_context = std::min(l_i, context);
    Hunk hunk(l_i - prefix_context + 1, r_i - prefix_context + 1);
    for (size_t i = prefix_context; i > 0; --i) {
      hunk.PushLine(' ', left[l_i - i].c_str());
    }

    // Iterate the edits until we found enough suffix for the hunk or the input
    // is over.
    size_t n_suffix = 0;
    for (; edit_i < edits.size(); ++edit_i) {
      if (n_suffix >= context) {
        // Continue only if the next hunk is very close.
        auto it = edits.begin() + static_cast<int>(edit_i);
        while (it != edits.end() && *it == kMatch) ++it;
        if (it == edits.end() ||
            static_cast<size_t>(it - edits.begin()) - edit_i >= context) {
          // There is no next edit or it is too far away.
          break;
        }
      }

      EditType edit = edits[edit_i];
      // Reset count when a non match is found.
      n_suffix = edit == kMatch ? n_suffix + 1 : 0;

      if (edit == kMatch || edit == kRemove || edit == kReplace) {
        hunk.PushLine(edit == kMatch ? ' ' : '-', left[l_i].c_str());
      }
      if (edit == kAdd || edit == kReplace) {
        hunk.PushLine('+', right[r_i].c_str());
      }

      // Advance indices, depending on edit type.
      l_i += edit != kAdd;
      r_i += edit != kRemove;
    }

    if (!hunk.has_edits()) {
      // We are done. We don't want this hunk.
      break;
    }

    hunk.PrintTo(&ss);
  }
  return ss.str();
}